

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

uint mp_hs_integer(mp_int *x,uintmax_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  BignumInt BVar4;
  ulong uVar5;
  
  uVar1 = x->nw;
  uVar5 = 1;
  uVar2 = ~n;
  for (uVar3 = 0; uVar1 + (uVar1 == 0) != uVar3; uVar3 = uVar3 + 1) {
    if (uVar3 < uVar1) {
      BVar4 = x->w[uVar3];
    }
    else {
      BVar4 = 0;
    }
    uVar5 = (ulong)CARRY8(uVar2,uVar5) + (ulong)CARRY8(uVar2 + uVar5,BVar4);
    uVar2 = 0xffffffffffffffff;
  }
  return (uint)uVar5;
}

Assistant:

unsigned mp_hs_integer(mp_int *x, uintmax_t n)
{
    BignumInt carry = 1;
    size_t nwords = sizeof(n)/BIGNUM_INT_BYTES;
    for (size_t i = 0, e = size_t_max(x->nw, nwords); i < e; i++) {
        BignumInt nword = n;
        n = shift_right_by_one_word(n);
        BignumInt dummy_out;
        BignumADC(dummy_out, carry, mp_word(x, i), ~nword, carry);
        (void)dummy_out;
    }
    return carry;
}